

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qht.c
# Opt level: O2

void qht_map_iter__all_locked(uc_struct_conflict5 *uc,qht_map *map,qht_iter *iter,void *userp)

{
  uc_struct_conflict5 *puVar1;
  char cVar2;
  void *pvVar3;
  int pos;
  qht_bucket *orig;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (map->n_buckets <= uVar4) {
      return;
    }
    orig = map->buckets + uVar4;
    do {
      for (pos = 0; pos < 4; pos = pos + 1) {
        pvVar3 = (void *)(long)pos;
        puVar1 = (uc_struct_conflict5 *)orig->pointers[(long)pvVar3];
        if (puVar1 == (uc_struct_conflict5 *)0x0) goto LAB_00b62bc0;
        if (iter->type == QHT_ITER_RM) {
          cVar2 = (*(iter->f).retvoid)
                            (puVar1,(void *)(ulong)orig->hashes[(long)pvVar3],(uint32_t)userp,pvVar3
                            );
          if (cVar2 != '\0') {
            qht_bucket_remove_entry(orig,pos);
            pos = pos + -1;
          }
        }
        else {
          if (iter->type != QHT_ITER_VOID) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/qht.c"
                       ,0x251,(char *)0x0);
          }
          (*(iter->f).retvoid)(uc,puVar1,orig->hashes[(long)pvVar3],userp);
        }
      }
      orig = orig->next;
    } while (orig != (qht_bucket *)0x0);
LAB_00b62bc0:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static inline void qht_map_iter__all_locked(struct uc_struct *uc, struct qht_map *map,
                                            const struct qht_iter *iter,
                                            void *userp)
{
    size_t i;

    for (i = 0; i < map->n_buckets; i++) {
        qht_bucket_iter(uc, &map->buckets[i], iter, userp);
    }
}